

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_counts(void)

{
  bitset_t *b1;
  bitset_t *b2;
  undefined8 uVar1;
  size_t sVar2;
  size_t i;
  
  b1 = bitset_create();
  i = 0;
  b2 = bitset_create();
  for (sVar2 = 0; sVar2 != 3000; sVar2 = sVar2 + 3) {
    bitset_set(b1,i);
    bitset_set(b2,sVar2);
    i = i + 2;
  }
  sVar2 = bitset_intersection_count(b1,b2);
  if (sVar2 == 0x14e) {
    sVar2 = bitset_union_count(b1,b2);
    if (sVar2 == 0x682) {
      bitset_free(b1);
      bitset_free(b2);
      return;
    }
    uVar1 = 0x9a;
  }
  else {
    uVar1 = 0x99;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_counts",uVar1);
  exit(1);
}

Assistant:

void test_counts() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 3 * k);
  }
  TEST_ASSERT(bitset_intersection_count(b1, b2) == 334);
  TEST_ASSERT(bitset_union_count(b1, b2) == 1666);
  bitset_free(b1);
  bitset_free(b2);
}